

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

vec<double,_4> * __thiscall
linalg::slerp<double,4>
          (vec<double,_4> *__return_storage_ptr__,linalg *this,vec<double,_4> *a,vec<double,_4> *b,
          double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar6 = uangle<double,4>((vec<double,_4> *)this,a);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar7 = sin((1.0 - t) * dVar6);
    dVar8 = sin(dVar6);
    dVar7 = dVar7 / dVar8;
    dVar8 = *(double *)this;
    dVar1 = *(double *)(this + 8);
    dVar2 = *(double *)(this + 0x10);
    dVar3 = *(double *)(this + 0x18);
    dVar9 = sin(dVar6 * t);
    dVar6 = sin(dVar6);
    dVar9 = dVar9 / dVar6;
    dVar6 = a->y;
    dVar4 = a->z;
    dVar5 = a->w;
    __return_storage_ptr__->x = a->x * dVar9 + dVar8 * dVar7;
    __return_storage_ptr__->y = dVar6 * dVar9 + dVar1 * dVar7;
    __return_storage_ptr__->z = dVar4 * dVar9 + dVar2 * dVar7;
    __return_storage_ptr__->w = dVar5 * dVar9 + dVar3 * dVar7;
  }
  else {
    dVar6 = *(double *)this;
    dVar8 = *(double *)(this + 8);
    dVar1 = *(double *)(this + 0x18);
    __return_storage_ptr__->z = *(double *)(this + 0x10);
    __return_storage_ptr__->w = dVar1;
    __return_storage_ptr__->x = dVar6;
    __return_storage_ptr__->y = dVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr vec<T,4> qconj(const vec<T,4> & q)                     { return {-q.x,-q.y,-q.z,q.w}; }